

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpStreamReader.cpp
# Opt level: O0

string * __thiscall
MLPStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,MLPStreamReader *this)

{
  ostream *poVar1;
  ostringstream local_190 [8];
  ostringstream str;
  MLPStreamReader *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((this->super_MLPCodec).m_subType == stTRUEHD) {
    std::operator<<((ostream *)local_190,"TRUE-HD");
  }
  else if ((this->super_MLPCodec).m_subType == stMLP) {
    std::operator<<((ostream *)local_190,"MLP");
  }
  else {
    std::operator<<((ostream *)local_190,"UNKNOWN");
  }
  if ((this->super_MLPCodec).m_substreams == '\x04') {
    std::operator<<((ostream *)local_190," + ATMOS");
  }
  std::operator<<((ostream *)local_190,". ");
  poVar1 = std::operator<<((ostream *)local_190,"Peak bitrate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MLPCodec).m_bitrate / 1000);
  std::operator<<(poVar1,"Kbps ");
  poVar1 = std::operator<<((ostream *)local_190,"Sample Rate: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_MLPCodec).m_samplerate / 1000);
  std::operator<<(poVar1,"KHz ");
  poVar1 = std::operator<<((ostream *)local_190,"Channels: ");
  std::ostream::operator<<(poVar1,(uint)(this->super_MLPCodec).m_channels);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

const std::string MLPStreamReader::getStreamInfo()
{
    std::ostringstream str;

    if (m_subType == MlpSubType::stTRUEHD)
        str << "TRUE-HD";
    else if (m_subType == MlpSubType::stMLP)
        str << "MLP";
    else
        str << "UNKNOWN";

    if (m_substreams == 4)
        str << " + ATMOS";
    str << ". ";
    str << "Peak bitrate: " << m_bitrate / 1000 << "Kbps ";
    str << "Sample Rate: " << m_samplerate / 1000 << "KHz ";
    str << "Channels: " << static_cast<int>(m_channels);
    return str.str();
}